

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.h
# Opt level: O2

int rnd_pcg_range(rnd_pcg_t *pcg,int min,int max)

{
  float fVar1;
  
  if (-1 < max - min) {
    fVar1 = rnd_pcg_nextf(pcg);
    min = min + (int)((float)((max - min) + 1) * fVar1);
  }
  return min;
}

Assistant:

int rnd_pcg_range( rnd_pcg_t* pcg, int min, int max )
    {
    int const range = ( max - min ) + 1;
    if( range <= 0 ) return min;
    int const value = (int) ( rnd_pcg_nextf( pcg ) * range );
    return min + value; 
    }